

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

ZSTD_bounds ZSTD_dParam_getBounds(ZSTD_dParameter dParam)

{
  ZSTD_bounds ZVar1;
  undefined8 uStack_18;
  ZSTD_dParameter dParam_local;
  ZSTD_bounds bounds;
  
  uStack_18 = 0;
  bounds.error._0_4_ = 0;
  bounds.error._4_4_ = 0;
  if (dParam == ZSTD_d_windowLogMax) {
    bounds.error._0_4_ = 10;
    bounds.error._4_4_ = 0x1f;
  }
  else if (dParam == ZSTD_d_experimentalParam1) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (dParam == ZSTD_d_experimentalParam2) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (dParam == ZSTD_d_experimentalParam3) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (dParam == ZSTD_d_experimentalParam4) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (dParam == ZSTD_d_experimentalParam5) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else {
    uStack_18 = 0xffffffffffffffd8;
  }
  ZVar1.lowerBound = (undefined4)bounds.error;
  ZVar1.error = uStack_18;
  ZVar1.upperBound = bounds.error._4_4_;
  return ZVar1;
}

Assistant:

ZSTD_bounds ZSTD_dParam_getBounds(ZSTD_dParameter dParam)
{
    ZSTD_bounds bounds = { 0, 0, 0 };
    switch(dParam) {
        case ZSTD_d_windowLogMax:
            bounds.lowerBound = ZSTD_WINDOWLOG_ABSOLUTEMIN;
            bounds.upperBound = ZSTD_WINDOWLOG_MAX;
            return bounds;
        case ZSTD_d_format:
            bounds.lowerBound = (int)ZSTD_f_zstd1;
            bounds.upperBound = (int)ZSTD_f_zstd1_magicless;
            ZSTD_STATIC_ASSERT(ZSTD_f_zstd1 < ZSTD_f_zstd1_magicless);
            return bounds;
        case ZSTD_d_stableOutBuffer:
            bounds.lowerBound = (int)ZSTD_bm_buffered;
            bounds.upperBound = (int)ZSTD_bm_stable;
            return bounds;
        case ZSTD_d_forceIgnoreChecksum:
            bounds.lowerBound = (int)ZSTD_d_validateChecksum;
            bounds.upperBound = (int)ZSTD_d_ignoreChecksum;
            return bounds;
        case ZSTD_d_refMultipleDDicts:
            bounds.lowerBound = (int)ZSTD_rmd_refSingleDDict;
            bounds.upperBound = (int)ZSTD_rmd_refMultipleDDicts;
            return bounds;
        case ZSTD_d_disableHuffmanAssembly:
            bounds.lowerBound = 0;
            bounds.upperBound = 1;
            return bounds;

        default:;
    }
    bounds.error = ERROR(parameter_unsupported);
    return bounds;
}